

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O0

AffixMatcherWarehouse * __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::operator=
          (AffixMatcherWarehouse *this,AffixMatcherWarehouse *param_1)

{
  long local_28;
  unsigned_long __i0_1;
  unsigned_long __i0;
  AffixMatcherWarehouse *param_1_local;
  AffixMatcherWarehouse *this_local;
  
  for (__i0_1 = 0; __i0_1 != 9; __i0_1 = __i0_1 + 1) {
    AffixMatcher::operator=(this->fAffixMatchers + __i0_1,param_1->fAffixMatchers + __i0_1);
  }
  for (local_28 = 0; local_28 != 6; local_28 = local_28 + 1) {
    AffixPatternMatcher::operator=
              (this->fAffixPatternMatchers + local_28,param_1->fAffixPatternMatchers + local_28);
  }
  this->fTokenWarehouse = param_1->fTokenWarehouse;
  return this;
}

Assistant:

AffixMatcherWarehouse() = default;